

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

bool __thiscall
cmsys::CommandLineArguments::GetMatchedArguments
          (CommandLineArguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *matches,string *arg)

{
  _Rb_tree_node_base *__rhs;
  __type _Var1;
  Internal *pIVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Self __tmp;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(matches);
  pIVar2 = this->Internals;
  p_Var3 = *(_Base_ptr *)
            ((long)&(pIVar2->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  do {
    if ((_Rb_tree_header *)p_Var3 ==
        &(pIVar2->Callbacks).
         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      return (matches->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (matches->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    }
    __rhs = p_Var3 + 1;
    if (((ulong)p_Var3[2]._M_parent & 0xfffffffd) == 0) {
      _Var1 = std::operator==(arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
      if (_Var1) {
LAB_0012b6d7:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(matches,(value_type *)__rhs);
      }
    }
    else {
      lVar4 = std::__cxx11::string::find((string *)arg,(ulong)__rhs);
      if (lVar4 == 0) goto LAB_0012b6d7;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    pIVar2 = this->Internals;
  } while( true );
}

Assistant:

bool CommandLineArguments::GetMatchedArguments(
  std::vector<std::string>* matches,
  const std::string& arg)
{
  matches->clear();
  CommandLineArguments::Internal::CallbacksMap::iterator it;

  // Does the argument match to any we know about?
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    const CommandLineArguments::Internal::String& parg = it->first;
    CommandLineArgumentsCallbackStructure *cs = &it->second;
    if (cs->ArgumentType == CommandLineArguments::NO_ARGUMENT ||
      cs->ArgumentType == CommandLineArguments::SPACE_ARGUMENT) 
      {
      if ( arg == parg )
        {
        matches->push_back(parg);
        }
      }
    else if ( arg.find( parg ) == 0 )
      {
      matches->push_back(parg);
      }
    }
  return !matches->empty();
}